

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__de_iphone(stbi__png *z)

{
  stbi_uc sVar1;
  byte bVar2;
  byte bVar3;
  stbi__context *psVar4;
  byte bVar5;
  uint uVar6;
  stbi_uc t_2;
  stbi_uc half;
  stbi_uc t_1;
  stbi_uc a;
  stbi_uc t;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  stbi__context *s;
  stbi__png *z_local;
  
  psVar4 = z->s;
  uVar6 = psVar4->img_x * psVar4->img_y;
  p = z->out;
  if (psVar4->img_out_n == 3) {
    for (i = 0; i < uVar6; i = i + 1) {
      sVar1 = *p;
      *p = p[2];
      p[2] = sVar1;
      p = p + 3;
    }
  }
  else if (stbi__unpremultiply_on_load == 0) {
    for (i = 0; i < uVar6; i = i + 1) {
      sVar1 = *p;
      *p = p[2];
      p[2] = sVar1;
      p = p + 4;
    }
  }
  else {
    for (i = 0; i < uVar6; i = i + 1) {
      bVar2 = p[3];
      bVar3 = *p;
      if (bVar2 == 0) {
        *p = p[2];
        p[2] = bVar3;
      }
      else {
        bVar5 = bVar2 / 2;
        *p = (stbi_uc)((ulong)((uint)p[2] * 0xff + (uint)bVar5) / (ulong)(long)(int)(uint)bVar2);
        p[1] = (stbi_uc)((ulong)((uint)p[1] * 0xff + (uint)bVar5) / (ulong)(long)(int)(uint)bVar2);
        p[2] = (stbi_uc)((ulong)((uint)bVar3 * 0xff + (uint)bVar5) / (ulong)(long)(int)(uint)bVar2);
      }
      p = p + 4;
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               stbi_uc half = a / 2;
               p[0] = (p[2] * 255 + half) / a;
               p[1] = (p[1] * 255 + half) / a;
               p[2] = ( t   * 255 + half) / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}